

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::ES5ArrayTypeHandlerBase<int>::HasAnyDataItemNotInMap
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  bool bVar1;
  uint32 key;
  IndexPropertyDescriptorMap *this_00;
  undefined1 local_38 [8];
  ArrayElementEnumerator e;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  e._16_8_ = arr;
  Js::JavascriptArray::ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_38,&arr->super_JavascriptArray,0,0xffffffff);
  do {
    bVar1 = Js::JavascriptArray::ArrayElementEnumerator::MoveNext<void*>
                      ((ArrayElementEnumerator *)local_38);
    if (!bVar1) {
      return false;
    }
    this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                        (&this->indexPropertyMap);
    key = Js::JavascriptArray::ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_38);
    bVar1 = IndexPropertyDescriptorMap::ContainsKey(this_00,key);
  } while (bVar1);
  return true;
}

Assistant:

bool ES5ArrayTypeHandlerBase<T>::HasAnyDataItemNotInMap(ES5Array* arr)
    {
        JavascriptArray::ArrayElementEnumerator e(arr);
        while (e.MoveNext<Var>())
        {
            if (!indexPropertyMap->ContainsKey(e.GetIndex()))
            {
                return true;
            }
        }

        return false;
    }